

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

int FindAndDelete(CScript *script,CScript *b)

{
  long lVar1;
  const_iterator b_00;
  const_iterator __last1;
  bool bVar2;
  difference_type dVar3;
  size_type sVar4;
  iterator last;
  iterator first;
  long in_FS_OFFSET;
  int nFound;
  opcodetype opcode;
  const_iterator end;
  const_iterator pc2;
  const_iterator pc;
  CScript result;
  undefined4 in_stack_fffffffffffffe98;
  size_type in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  const_iterator in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  const_iterator in_stack_fffffffffffffeb8;
  size_type in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  const_iterator in_stack_ffffffffffffff10;
  const_iterator in_stack_ffffffffffffff18;
  undefined4 local_a4;
  undefined4 local_8c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_a4 = 0;
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (bVar2) {
    local_8c = 0;
  }
  else {
    CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    last = prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                     ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                      CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::const_iterator
              ((const_iterator *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (iterator)in_stack_fffffffffffffea8.ptr);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::const_iterator
              ((const_iterator *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (iterator)in_stack_fffffffffffffea8.ptr);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::const_iterator
              ((const_iterator *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (iterator)in_stack_fffffffffffffea8.ptr);
    do {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                 (iterator)in_stack_ffffffffffffff18.ptr,in_stack_ffffffffffffff10,
                 (const_iterator)last.ptr);
      while( true ) {
        b_00.ptr._4_4_ = in_stack_fffffffffffffea4;
        b_00.ptr._0_4_ = in_stack_fffffffffffffea0;
        dVar3 = operator-(in_stack_fffffffffffffea8,b_00);
        sVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           in_stack_fffffffffffffea8.ptr);
        in_stack_fffffffffffffedf = false;
        if ((ulong)sVar4 <= (ulong)(long)dVar3) {
          prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          in_stack_ffffffffffffff18 =
               prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          __last1.ptr._4_4_ = in_stack_fffffffffffffec4;
          __last1.ptr._0_4_ = in_stack_fffffffffffffec0;
          in_stack_fffffffffffffedf =
               std::
               equal<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                         (in_stack_ffffffffffffff18,__last1,in_stack_fffffffffffffeb8);
          in_stack_fffffffffffffec4 =
               CONCAT13(in_stack_fffffffffffffedf,(int3)in_stack_fffffffffffffec4);
        }
        if ((bool)in_stack_fffffffffffffedf == false) break;
        in_stack_fffffffffffffec0 =
             prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        in_stack_fffffffffffffea8.ptr);
        in_stack_fffffffffffffeb8 =
             prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                       ((const_iterator *)
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                        in_stack_fffffffffffffe9c);
        local_a4 = local_a4 + 1;
      }
      in_stack_fffffffffffffeb7 =
           CScript::GetOp((CScript *)in_stack_fffffffffffffeb8.ptr,
                          (const_iterator *)
                          CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                          (opcodetype *)in_stack_fffffffffffffea8.ptr);
    } while ((bool)in_stack_fffffffffffffeb7);
    if (0 < local_a4) {
      first = prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                 (iterator)in_stack_ffffffffffffff18.ptr,(const_iterator)first.ptr,
                 (const_iterator)last.ptr);
      CScript::operator=((CScript *)first.ptr,
                         (CScript *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
    local_8c = local_a4;
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_8c;
  }
  __stack_chk_fail();
}

Assistant:

int FindAndDelete(CScript& script, const CScript& b)
{
    int nFound = 0;
    if (b.empty())
        return nFound;
    CScript result;
    CScript::const_iterator pc = script.begin(), pc2 = script.begin(), end = script.end();
    opcodetype opcode;
    do
    {
        result.insert(result.end(), pc2, pc);
        while (static_cast<size_t>(end - pc) >= b.size() && std::equal(b.begin(), b.end(), pc))
        {
            pc = pc + b.size();
            ++nFound;
        }
        pc2 = pc;
    }
    while (script.GetOp(pc, opcode));

    if (nFound > 0) {
        result.insert(result.end(), pc2, end);
        script = std::move(result);
    }

    return nFound;
}